

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

bool __thiscall cfd::core::AbstractTxIn::IsCoinBase(AbstractTxIn *this)

{
  uint32_t uVar1;
  int iVar2;
  undefined8 *__s2;
  value_type_conflict *__val;
  bool bVar3;
  ByteData local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  __s2 = (undefined8 *)operator_new(0x20);
  *__s2 = 0;
  __s2[1] = 0;
  __s2[2] = 0;
  __s2[3] = 0;
  uVar1 = this->vout_;
  if (uVar1 == 0xffffffff) {
    Txid::GetData(&local_50,&this->txid_);
    ByteData::GetBytes(&local_38,&local_50);
    if ((long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0x20) {
      if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,__s2,0x20);
        bVar3 = iVar2 == 0;
      }
      goto LAB_0032da49;
    }
  }
  bVar3 = false;
LAB_0032da49:
  if (uVar1 == 0xffffffff) {
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  operator_delete(__s2);
  return bVar3;
}

Assistant:

bool AbstractTxIn::IsCoinBase() const {
  bool is_coinbase = false;
  std::vector<uint8_t> empty_txid(kByteData256Length);
  if ((vout_ == std::numeric_limits<uint32_t>::max()) &&
      (txid_.GetData().GetBytes() == empty_txid)) {
    is_coinbase = true;
  }
  return is_coinbase;
}